

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall
summarycalc::dosummary
          (summarycalc *this,int sample_size,int event_id,int item_id,int coverage_or_output_id,
          int sidx,OASIS_FLOAT gul,OASIS_FLOAT expval)

{
  int iVar1;
  bool bVar2;
  reference piVar3;
  reference pvVar4;
  OASIS_FLOAT *se;
  int summary_id;
  coverage_id_or_output_id_to_Summary_id *p;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  iterator it;
  OASIS_FLOAT expval_local;
  OASIS_FLOAT gul_local;
  int sidx_local;
  int coverage_or_output_id_local;
  int item_id_local;
  int event_id_local;
  int sample_size_local;
  summarycalc *this_local;
  
  it._M_current._4_4_ = expval;
  if (this->last_event_id_ != event_id) {
    reset_for_new_event(this,sample_size,event_id);
  }
  if (item_id != this->last_item_id_) {
    local_38._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(&this->foutIndex_);
    while( true ) {
      p = (coverage_id_or_output_id_to_Summary_id *)
          std::vector<int,_std::allocator<int>_>::end(&this->foutIndex_);
      bVar2 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&p);
      if (!bVar2) break;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_38);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         (this->co_to_s_[*piVar3],(long)coverage_or_output_id);
      iVar1 = *pvVar4;
      piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_38);
      this->sse[*piVar3][iVar1] = it._M_current._4_4_ + this->sse[*piVar3][iVar1];
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_38);
    }
    this->last_item_id_ = item_id;
  }
  processsummarysets(this,coverage_or_output_id,sidx,gul);
  return;
}

Assistant:

void summarycalc::dosummary(int sample_size, int event_id, int item_id,
			    int coverage_or_output_id, int sidx,
			    OASIS_FLOAT gul, OASIS_FLOAT expval)
{
	if (last_event_id_ != event_id)
		reset_for_new_event(sample_size, event_id);

	if (item_id != last_item_id_) {
		for (auto it = foutIndex_.begin(); it != foutIndex_.end(); ++it) {
			coverage_id_or_output_id_to_Summary_id &p = *co_to_s_[*it];
			int summary_id = p[coverage_or_output_id];
			OASIS_FLOAT *se = sse[*it];
			se[summary_id] += expval;
		}
		last_item_id_ = item_id;
	}

	processsummarysets(coverage_or_output_id, sidx, gul);
}